

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double *dx,
            double maxstep,int retcode,double *L,double *hess,double stol,int method,double *ioval,
            double *xprev,double *funcprev,double *x)

{
  double dVar1;
  double *C;
  double *array;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *__format;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar1 = *ioval;
  C = (double *)malloc(8);
  array = (double *)malloc((long)N * 8);
  dVar9 = 0.0;
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar9 = dVar9 + dx[uVar2] * step[uVar2] * dx[uVar2] * step[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar10 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar10)) {
LAB_001272b4:
    __format = "Program Exiting as the function value exceeds the maximum double value";
  }
  else {
    if (!NAN(dVar10)) {
      madd(xi,step,x,1,N);
      dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_001272b4;
      if (NAN(dVar11)) goto LAB_00127692;
      dVar10 = dVar11 - dVar10;
      mmult(jac,step,C,1,N,1);
      if (retcode == 3) {
        dVar12 = *C;
        dVar13 = dVar12 * 0.0001;
        if ((dVar10 <= dVar13) && (dVar11 < *funcprev)) goto LAB_001272f6;
        if (0 < N) {
          uVar2 = 0;
          do {
            x[uVar2] = xprev[uVar2];
            uVar2 = uVar2 + 1;
          } while ((uint)N != uVar2);
        }
        iVar8 = 0;
        dVar14 = dVar1 * 0.5;
      }
      else {
        *funcprev = 0.0;
        dVar12 = *C;
        dVar13 = dVar12 * 0.0001;
LAB_001272f6:
        dVar14 = dVar1;
        if (dVar13 <= dVar10) {
          if (N < 1) {
            dVar11 = array_max_abs(array,N);
            iVar8 = 1;
            if (stol <= dVar11) {
LAB_0012746d:
              dVar9 = (-*C * dVar9) / ((dVar10 - dVar9) + (dVar10 - dVar9));
              iVar8 = 2;
              dVar14 = dVar1 * 0.1;
              if ((dVar1 * 0.1 <= dVar9) && (dVar14 = dVar1 * 0.5, dVar9 <= dVar1 * 0.5)) {
                dVar14 = dVar9;
              }
            }
          }
          else {
            uVar2 = 0;
            do {
              dVar11 = ABS(xi[uVar2]);
              if (ABS(xi[uVar2]) <= 1.0 / ABS(dx[uVar2])) {
                dVar11 = 1.0 / ABS(dx[uVar2]);
              }
              array[uVar2] = step[uVar2] / dVar11;
              uVar2 = uVar2 + 1;
            } while ((uint)N != uVar2);
            dVar11 = array_max_abs(array,N);
            if (stol <= dVar11) goto LAB_0012746d;
            iVar8 = 1;
            if (0 < N) {
              uVar2 = 0;
              do {
                x[uVar2] = xi[uVar2];
                uVar2 = uVar2 + 1;
              } while ((uint)N != uVar2);
            }
          }
        }
        else {
          dVar9 = dVar12;
          if (method == 0) {
            if (0 < N) {
              uVar3 = (ulong)(uint)N;
              uVar4 = 0;
              uVar2 = uVar3;
              pdVar5 = step;
              pdVar7 = hess;
              do {
                dVar13 = step[uVar4];
                dVar15 = hess[uVar4 + (uint)((int)uVar4 * N)] * 0.5 * dVar13 * dVar13;
                uVar4 = uVar4 + 1;
                if ((long)uVar4 < (long)N) {
                  uVar6 = 1;
                  do {
                    dVar15 = dVar15 + pdVar7[uVar6] * dVar13 * pdVar5[uVar6];
                    uVar6 = uVar6 + 1;
                  } while (uVar2 != uVar6);
                }
                dVar9 = dVar9 + dVar15;
                pdVar7 = pdVar7 + uVar3 + 1;
                pdVar5 = pdVar5 + 1;
                uVar2 = uVar2 - 1;
              } while (uVar4 != uVar3);
            }
          }
          else if ((method == 1) && (0 < N)) {
            uVar3 = (ulong)(uint)N;
            uVar4 = 0;
            uVar2 = uVar3;
            do {
              dVar13 = 0.0;
              uVar6 = 0;
              pdVar5 = L;
              do {
                dVar13 = dVar13 + *pdVar5 * step[uVar6];
                pdVar5 = pdVar5 + uVar3;
                uVar6 = uVar6 + 1;
              } while (uVar2 != uVar6);
              dVar9 = dVar9 + dVar13 * dVar13 * 0.5;
              uVar4 = uVar4 + 1;
              L = L + uVar3 + 1;
              step = step + 1;
              uVar2 = uVar2 - 1;
            } while (uVar4 != uVar3);
          }
          if ((retcode == 2) ||
             ((((ABS(dVar10) < ABS(dVar9 - dVar10) && (dVar12 < dVar10)) || (ioval[6] != 0.0)) ||
              ((NAN(ioval[6]) || (maxstep * 0.99 < dVar1)))))) {
            if (dVar9 * 0.1 <= dVar10) {
              iVar8 = 0;
              dVar14 = dVar1 * 0.5;
            }
            else {
              iVar8 = 0;
              if ((dVar10 <= dVar9 * 0.75) && (dVar14 = dVar1 + dVar1, maxstep <= dVar1 + dVar1)) {
                dVar14 = maxstep;
              }
            }
          }
          else {
            *funcprev = dVar11;
            if (0 < N) {
              uVar2 = 0;
              do {
                xprev[uVar2] = x[uVar2];
                uVar2 = uVar2 + 1;
              } while ((uint)N != uVar2);
            }
            dVar14 = dVar1 + dVar1;
            if (maxstep <= dVar1 + dVar1) {
              dVar14 = maxstep;
            }
            iVar8 = 3;
          }
        }
      }
      *ioval = dVar14;
      goto LAB_00127673;
    }
LAB_00127692:
    __format = "Program Exiting as the function returns NaN";
  }
  printf(__format);
  iVar8 = 0xf;
LAB_00127673:
  free(array);
  free(C);
  return iVar8;
}

Assistant:

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double * dx,double maxstep,
		int retcode,double *L,double *hess,double stol,int method,double *ioval,double *xprev,double *funcprev,double *x) {
			
	int retval;	
	int i,j,c1;
	double delta,alpha,nlen,rell,den,deltatemp;
	double funci,funcf,df,dfp,temp;
	double *slopei,*rcheck;
	/*Return Codes
	 * 
	 * 0 - x Accepted.
	 * 1 - x unsatisfactory but (x-xi) is smaller than stopping criteria stol
	 * 2 - f(x) large. Reduce delta
	 * 3 - f(x) sufficiently small. Double delta
	 * 
	 */ 
	 
	alpha = 1.0e-04;
	delta = ioval[0];
	nlen = 0.0;
	 
	slopei = (double*) malloc(sizeof(double) *1);
	rcheck = (double*) malloc(sizeof(double) *N);
 
	for(i = 0; i < N;++i) {
		nlen += dx[i] * step[i] * dx[i] * step[i];
	}
	nlen = sqrt(nlen);
	
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	madd(xi,step,x,1,N);
	
	funcf = FUNCPT_EVAL(funcpt, x, N);
	if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funcf != funcf) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	df = funcf - funci;
	mmult(jac,step,slopei,1,N,1);
	 
	if (retcode != 3) {
		*funcprev = 0.;
	} 
	
	if ((df > alpha *slopei[0] || funcf >= *funcprev) && retcode == 3) {
		for(i = 0;i < N;++i) {
			x[i] = xprev[i];
		}
		retval = 0;
		funcf = *funcprev;
		delta /= 2.0;
	} else if (df >= alpha *slopei[0]) {
		for(i = 0; i < N;++i) {
			if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
				den = fabs(xi[i]);
			} else {
				den = 1.0 /fabs(dx[i]);
			}
			rcheck[i] = step[i]/den;
		}
	
		rell = array_max_abs(rcheck,N);
		
		if (rell < stol) {
			retval = 1;
			for(i = 0; i < N;++i) {
				x[i] = xi[i];
			}
		} else {
			retval = 2;
			deltatemp = - slopei[0] * nlen /(2*(df - nlen));
			if (deltatemp < 0.1 * delta) {
				delta *= 0.1;
			} else if (deltatemp > 0.5 * delta) {
				delta *= 0.5;
			} else {
				delta = deltatemp;
			}
		}
		
	} else {
		dfp = slopei[0];
		if (method == 0) {
			for (i = 0;i < N;++i) {
				//Hook
				c1 = i * N;
				temp = 0.5 * hess[c1+i] * step[i] * step[i];
				for (j = i+1; j < N;++j) {
					temp += hess[c1+j] * step[i] * step[j];
				}
				dfp += temp;
			}
		} else if (method == 1) {
			//Double Dogleg
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N+i] * step[j];
				}
				dfp += temp*temp/2.0;
			}
		}
		
		if ((retcode != 2) && (fabs(dfp - df) <= fabs(df) || df <= slopei[0]) && (ioval[6] == 0.0) && (delta <= 0.99*maxstep)) {
			retval = 3;
			*funcprev = funcf;
			for(i = 0; i < N;++i) {
				xprev[i] = x[i];
			}
			if (maxstep > 2*delta) {
				delta = 2 * delta;
			} else {
				delta = maxstep;
			}
			
		} else {
			retval = 0;
			if (df >= 0.1 * dfp) {
				delta = delta/2;
			} else if (df <= 0.75 *dfp) {
				if (maxstep > 2*delta) {
				delta = 2 * delta;
				} else {
					delta = maxstep;
				}
				
			}
		}
	}
	
	
	ioval[0] = delta;
	free(rcheck);
	free(slopei); 
	return retval;
		
}